

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O2

void __thiscall
pybind11::array::array
          (array *this,dtype *dt,ShapeContainer *shape,StridesContainer *strides,void *ptr,
          handle base)

{
  _func_int_PyObject_ptr_PyObject_ptr *p_Var1;
  object oVar2;
  dtype dVar3;
  bool bVar4;
  pointer plVar5;
  npy_api *pnVar6;
  error_already_set *this_00;
  pointer plVar7;
  ulong uVar8;
  uint uVar9;
  object tmp;
  dtype descr;
  object local_38;
  
  (this->super_buffer).super_object.super_handle.m_ptr = (PyObject *)0x0;
  plVar7 = (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar5 = (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar7 == plVar5) {
    detail::c_strides((vector<long,_std::allocator<long>_> *)&descr,&shape->v,
                      (long)(int)(dt->super_object).super_handle.m_ptr[2].ob_refcnt);
    std::vector<long,_std::allocator<long>_>::_M_move_assign
              (&strides->v,(_Vector_base<long,_std::allocator<long>_> *)&descr);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)&descr);
    plVar7 = (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar5 = (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  uVar8 = (long)(shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 != (long)plVar5 - (long)plVar7) {
    pybind11_fail("NumPy: shape ndim doesn\'t match strides ndim");
  }
  descr.super_object.super_handle.m_ptr = (object)(dt->super_object).super_handle.m_ptr;
  if (descr.super_object.super_handle.m_ptr != (handle)0x0) {
    *(long *)descr.super_object.super_handle.m_ptr =
         *(long *)descr.super_object.super_handle.m_ptr + 1;
  }
  uVar9 = 0;
  if (ptr != (void *)0x0 && base.m_ptr != (PyObject *)0x0) {
    bVar4 = check_(base);
    uVar9 = 0x400;
    if (bVar4) {
      (base.m_ptr)->ob_refcnt = (base.m_ptr)->ob_refcnt + 1;
      uVar9 = (uint)base.m_ptr[4].ob_refcnt & 0xfffffffb;
      tmp.super_handle.m_ptr = (handle)(handle)base.m_ptr;
      object::~object(&tmp);
    }
  }
  pnVar6 = detail::npy_api::get();
  dVar3 = descr;
  descr.super_object.super_handle.m_ptr = (object)(handle)0x0;
  tmp.super_handle.m_ptr =
       (handle)(*pnVar6->PyArray_NewFromDescr_)
                         (pnVar6->PyArray_Type_,(PyObject *)dVar3.super_object.super_handle.m_ptr,
                          (int)(uVar8 >> 3),
                          (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,ptr,uVar9,(PyObject *)0x0);
  if (tmp.super_handle.m_ptr != (PyObject *)0x0) {
    if (ptr != (void *)0x0) {
      if (base.m_ptr == (PyObject *)0x0) {
        local_38.super_handle.m_ptr =
             (handle)(*pnVar6->PyArray_NewCopy_)((PyObject *)tmp.super_handle.m_ptr,-1);
        object::operator=(&tmp,&local_38);
        object::~object(&local_38);
      }
      else {
        p_Var1 = pnVar6->PyArray_SetBaseObject_;
        (base.m_ptr)->ob_refcnt = (base.m_ptr)->ob_refcnt + 1;
        (*p_Var1)((PyObject *)tmp.super_handle.m_ptr,base.m_ptr);
      }
    }
    oVar2.super_handle.m_ptr = tmp.super_handle.m_ptr;
    tmp.super_handle.m_ptr = (handle)(PyObject *)0x0;
    (this->super_buffer).super_object.super_handle.m_ptr = (PyObject *)oVar2.super_handle.m_ptr;
    object::~object(&tmp);
    object::~object(&descr.super_object);
    return;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

array(const pybind11::dtype &dt,
          ShapeContainer shape,
          StridesContainer strides,
          const void *ptr = nullptr,
          handle base = handle()) {

        if (strides->empty()) {
            *strides = detail::c_strides(*shape, dt.itemsize());
        }

        auto ndim = shape->size();
        if (ndim != strides->size()) {
            pybind11_fail("NumPy: shape ndim doesn't match strides ndim");
        }
        auto descr = dt;

        int flags = 0;
        if (base && ptr) {
            if (isinstance<array>(base)) {
                /* Copy flags from base (except ownership bit) */
                flags = reinterpret_borrow<array>(base).flags()
                        & ~detail::npy_api::NPY_ARRAY_OWNDATA_;
            } else {
                /* Writable by default, easy to downgrade later on if needed */
                flags = detail::npy_api::NPY_ARRAY_WRITEABLE_;
            }
        }

        auto &api = detail::npy_api::get();
        auto tmp = reinterpret_steal<object>(api.PyArray_NewFromDescr_(
            api.PyArray_Type_,
            descr.release().ptr(),
            (int) ndim,
            // Use reinterpret_cast for PyPy on Windows (remove if fixed, checked on 7.3.1)
            reinterpret_cast<Py_intptr_t *>(shape->data()),
            reinterpret_cast<Py_intptr_t *>(strides->data()),
            const_cast<void *>(ptr),
            flags,
            nullptr));
        if (!tmp) {
            throw error_already_set();
        }
        if (ptr) {
            if (base) {
                api.PyArray_SetBaseObject_(tmp.ptr(), base.inc_ref().ptr());
            } else {
                tmp = reinterpret_steal<object>(
                    api.PyArray_NewCopy_(tmp.ptr(), -1 /* any order */));
            }
        }
        m_ptr = tmp.release().ptr();
    }